

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Float __thiscall pbrt::Image::BilerpChannel(Image *this,Point2f p,int c,WrapMode2D wrapMode)

{
  span<const_float> v_00;
  initializer_list<float> v_01;
  initializer_list<float> v_02;
  WrapMode2D wrapMode_00;
  WrapMode2D wrapMode_01;
  WrapMode2D wrapMode_02;
  WrapMode2D wrapMode_03;
  Point2i p_00;
  Point2i p_01;
  Point2i p_02;
  Point2i p_03;
  float *pfVar1;
  Image *in_RDX;
  array<float,_4> *in_RDI;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [12];
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  array<float,_4> v;
  Float dy;
  Float dx;
  int yi;
  int xi;
  Float y;
  Float x;
  Tuple2<pbrt::Point2,_float> *this_00;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar9;
  span<const_float> *this_01;
  undefined8 in_stack_ffffffffffffff30;
  float fVar10;
  float fVar11;
  array<float,_4> *in_stack_ffffffffffffff40;
  array<float,_2> p_04;
  iterator in_stack_ffffffffffffff48;
  size_type in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff84;
  WrapMode in_stack_ffffffffffffff94;
  WrapMode in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  span<const_float> local_44;
  float local_34;
  float local_30;
  int local_2c;
  int local_28;
  float local_24;
  float local_20;
  Image *local_10;
  Tuple2<pbrt::Point2,_float> local_8;
  
  local_8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  this_00 = &local_8;
  local_10 = in_RDX;
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](this_00,0);
  auVar6._0_4_ = (float)(int)in_RDI->values[1];
  auVar6._4_12_ = in_ZMM0._4_12_;
  uVar9 = 0xbf000000;
  auVar6 = vfmadd213ss_fma(auVar6,ZEXT416((uint)*pfVar1),SUB6416(ZEXT464(0xbf000000),0));
  auVar8 = auVar6._4_12_;
  local_20 = auVar6._0_4_;
  pfVar1 = Tuple2<pbrt::Point2,_float>::operator[](this_00,1);
  auVar7._0_4_ = (float)(int)in_RDI->values[2];
  auVar7._4_12_ = auVar8;
  auVar6 = vfmadd213ss_fma(auVar7,ZEXT416((uint)*pfVar1),ZEXT416(uVar9));
  local_24 = auVar6._0_4_;
  dVar5 = std::floor((double)(ulong)(uint)local_20);
  local_28 = (int)SUB84(dVar5,0);
  dVar5 = std::floor((double)(ulong)(uint)local_24);
  local_2c = (int)SUB84(dVar5,0);
  local_30 = local_20 - (float)local_28;
  local_34 = local_24 - (float)local_2c;
  Point2<int>::Point2((Point2<int> *)CONCAT44(uVar9,in_stack_ffffffffffffff10),
                      (int)((ulong)this_00 >> 0x20),(int)this_00);
  p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffffa0;
  p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffff9c;
  wrapMode_00.wrap.values[1] = in_stack_ffffffffffffff98;
  wrapMode_00.wrap.values[0] = in_stack_ffffffffffffff94;
  FVar2 = GetChannel(local_10,p_00,in_stack_ffffffffffffff84,wrapMode_00);
  Point2<int>::Point2((Point2<int> *)CONCAT44(uVar9,in_stack_ffffffffffffff10),
                      (int)((ulong)this_00 >> 0x20),(int)this_00);
  p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffffa0;
  p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffff9c;
  wrapMode_01.wrap.values[1] = (WrapMode)FVar2;
  wrapMode_01.wrap.values[0] = in_stack_ffffffffffffff94;
  FVar3 = GetChannel(local_10,p_01,in_stack_ffffffffffffff84,wrapMode_01);
  Point2<int>::Point2((Point2<int> *)CONCAT44(uVar9,in_stack_ffffffffffffff10),
                      (int)((ulong)this_00 >> 0x20),(int)this_00);
  p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffffa0;
  p_02.super_Tuple2<pbrt::Point2,_int>.x = (int)FVar3;
  wrapMode_02.wrap.values[1] = (WrapMode)FVar2;
  wrapMode_02.wrap.values[0] = in_stack_ffffffffffffff94;
  FVar4 = GetChannel(local_10,p_02,in_stack_ffffffffffffff84,wrapMode_02);
  Point2<int>::Point2((Point2<int> *)CONCAT44(uVar9,in_stack_ffffffffffffff10),
                      (int)((ulong)this_00 >> 0x20),(int)this_00);
  p_03.super_Tuple2<pbrt::Point2,_int>.y = (int)FVar4;
  p_03.super_Tuple2<pbrt::Point2,_int>.x = (int)FVar3;
  wrapMode_03.wrap.values[1] = (WrapMode)FVar2;
  wrapMode_03.wrap.values[0] = in_stack_ffffffffffffff94;
  GetChannel(local_10,p_03,in_stack_ffffffffffffff84,wrapMode_03);
  this_01 = &local_44;
  v_01._M_len = in_stack_ffffffffffffff50;
  v_01._M_array = in_stack_ffffffffffffff48;
  pstd::array<float,_4>::array(in_stack_ffffffffffffff40,v_01);
  p_04.values = (float  [2])&stack0xffffffffffffff38;
  v_02._M_len = in_stack_ffffffffffffff50;
  v_02._M_array = (iterator)0x2;
  fVar10 = local_30;
  fVar11 = local_34;
  pstd::array<float,_2>::array((array<float,_2> *)p_04.values,v_02);
  pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>(this_01,in_RDI);
  v_00.n._0_4_ = fVar10;
  v_00.ptr = (float *)in_stack_ffffffffffffff30;
  v_00.n._4_4_ = fVar11;
  FVar2 = pbrt::Bilerp(p_04,v_00);
  return FVar2;
}

Assistant:

PBRT_CPU_GPU
    Float BilerpChannel(Point2f p, int c, WrapMode2D wrapMode = WrapMode::Clamp) const {
        Float x = p[0] * resolution.x - 0.5f, y = p[1] * resolution.y - 0.5f;
        int xi = std::floor(x), yi = std::floor(y);
        Float dx = x - xi, dy = y - yi;
        pstd::array<Float, 4> v = {GetChannel({xi, yi}, c, wrapMode),
                                   GetChannel({xi + 1, yi}, c, wrapMode),
                                   GetChannel({xi, yi + 1}, c, wrapMode),
                                   GetChannel({xi + 1, yi + 1}, c, wrapMode)};
        return pbrt::Bilerp({dx, dy}, v);
    }